

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec2_smpl.c
# Opt level: O0

int ec_GF2m_simple_points_mul
              (EC_GROUP *group,EC_POINT *r,BIGNUM *scalar,size_t num,EC_POINT **points,
              BIGNUM **scalars,BN_CTX *ctx)

{
  int iVar1;
  EC_POINT *a;
  ulong in_RCX;
  long in_RDX;
  BN_CTX *in_RSI;
  EC_POINT *in_RDI;
  EC_POINT *unaff_retaddr;
  EC_GROUP *in_stack_00000008;
  EC_POINT *t;
  int ret;
  BIGNUM **in_stack_000000a0;
  EC_POINT **in_stack_000000a8;
  size_t in_stack_000000b0;
  BIGNUM *in_stack_000000b8;
  EC_POINT *in_stack_000000c0;
  EC_GROUP *in_stack_000000c8;
  BN_CTX *in_stack_000000e0;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar2 = 0;
  if (((in_RCX < 2) && (iVar1 = BN_is_zero(in_RDI->X), iVar1 == 0)) &&
     (iVar1 = BN_is_zero(in_RDI->Y), iVar1 == 0)) {
    if ((in_RDX == 0) || (in_RCX != 0)) {
      if ((in_RDX == 0) && (in_RCX == 1)) {
        iVar2 = ossl_ec_scalar_mul_ladder
                          (in_stack_00000008,unaff_retaddr,
                           (BIGNUM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                           in_RDI,in_RSI);
      }
      else {
        a = EC_POINT_new((EC_GROUP *)in_RDI);
        if (a == (EC_POINT *)0x0) {
          ERR_new();
          ERR_set_debug((char *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),(int)((ulong)a >> 0x20),
                        in_stack_ffffffffffffffb0);
          ERR_set_error(0x10,0xc0100,(char *)0x0);
          iVar2 = 0;
        }
        else {
          iVar1 = ossl_ec_scalar_mul_ladder
                            (in_stack_00000008,unaff_retaddr,
                             (BIGNUM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                             ,in_RDI,in_RSI);
          if (((iVar1 != 0) &&
              (iVar1 = ossl_ec_scalar_mul_ladder
                                 (in_stack_00000008,unaff_retaddr,
                                  (BIGNUM *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  in_RDI,in_RSI), iVar1 != 0)) &&
             (iVar1 = EC_POINT_add((EC_GROUP *)in_RDI,(EC_POINT *)in_RSI,a,(EC_POINT *)in_RSI,
                                   (BN_CTX *)in_stack_00000008), iVar1 != 0)) {
            iVar2 = 1;
          }
          EC_POINT_free(a);
        }
      }
    }
    else {
      iVar2 = ossl_ec_scalar_mul_ladder
                        (in_stack_00000008,unaff_retaddr,
                         (BIGNUM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                         in_RDI,in_RSI);
    }
  }
  else {
    iVar2 = ossl_ec_wNAF_mul(in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,in_stack_000000b0
                             ,in_stack_000000a8,in_stack_000000a0,in_stack_000000e0);
  }
  return iVar2;
}

Assistant:

static
int ec_GF2m_simple_points_mul(const EC_GROUP *group, EC_POINT *r,
                              const BIGNUM *scalar, size_t num,
                              const EC_POINT *points[],
                              const BIGNUM *scalars[],
                              BN_CTX *ctx)
{
    int ret = 0;
    EC_POINT *t = NULL;

    /*-
     * We limit use of the ladder only to the following cases:
     * - r := scalar * G
     *   Fixed point mul: scalar != NULL && num == 0;
     * - r := scalars[0] * points[0]
     *   Variable point mul: scalar == NULL && num == 1;
     * - r := scalar * G + scalars[0] * points[0]
     *   used, e.g., in ECDSA verification: scalar != NULL && num == 1
     *
     * In any other case (num > 1) we use the default wNAF implementation.
     *
     * We also let the default implementation handle degenerate cases like group
     * order or cofactor set to 0.
     */
    if (num > 1 || BN_is_zero(group->order) || BN_is_zero(group->cofactor))
        return ossl_ec_wNAF_mul(group, r, scalar, num, points, scalars, ctx);

    if (scalar != NULL && num == 0)
        /* Fixed point multiplication */
        return ossl_ec_scalar_mul_ladder(group, r, scalar, NULL, ctx);

    if (scalar == NULL && num == 1)
        /* Variable point multiplication */
        return ossl_ec_scalar_mul_ladder(group, r, scalars[0], points[0], ctx);

    /*-
     * Double point multiplication:
     *  r := scalar * G + scalars[0] * points[0]
     */

    if ((t = EC_POINT_new(group)) == NULL) {
        ERR_raise(ERR_LIB_EC, ERR_R_MALLOC_FAILURE);
        return 0;
    }

    if (!ossl_ec_scalar_mul_ladder(group, t, scalar, NULL, ctx)
        || !ossl_ec_scalar_mul_ladder(group, r, scalars[0], points[0], ctx)
        || !EC_POINT_add(group, r, t, r, ctx))
        goto err;

    ret = 1;

 err:
    EC_POINT_free(t);
    return ret;
}